

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  RTCIntersectFunctionN p_Var17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 extraout_var [56];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1360;
  int local_1354;
  RayQueryContext *local_1350;
  ulong local_1348;
  Ray *local_1340;
  Scene *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      aVar5 = (ray->dir).field_0;
      auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx((undefined1  [16])aVar5,auVar24);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar24 = vcmpps_avx(auVar24,auVar40,1);
      auVar24 = vblendvps_avx((undefined1  [16])aVar5,auVar40,auVar24);
      local_1360 = local_11d0;
      auVar40 = vrcpps_avx(auVar24);
      fVar33 = auVar40._0_4_;
      auVar28._0_4_ = fVar33 * auVar24._0_4_;
      fVar37 = auVar40._4_4_;
      auVar28._4_4_ = fVar37 * auVar24._4_4_;
      fVar38 = auVar40._8_4_;
      auVar28._8_4_ = fVar38 * auVar24._8_4_;
      fVar39 = auVar40._12_4_;
      auVar28._12_4_ = fVar39 * auVar24._12_4_;
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar24 = vsubps_avx(auVar41,auVar28);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar45 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar46 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar47 = ZEXT3264(local_1238);
      auVar29._0_4_ = fVar33 + fVar33 * auVar24._0_4_;
      auVar29._4_4_ = fVar37 + fVar37 * auVar24._4_4_;
      auVar29._8_4_ = fVar38 + fVar38 * auVar24._8_4_;
      auVar29._12_4_ = fVar39 + fVar39 * auVar24._12_4_;
      auVar24 = vshufps_avx(auVar29,auVar29,0);
      local_1258._16_16_ = auVar24;
      local_1258._0_16_ = auVar24;
      auVar48 = ZEXT3264(local_1258);
      auVar24 = vmovshdup_avx(auVar29);
      auVar36 = ZEXT1664(auVar24);
      auVar40 = vshufps_avx(auVar29,auVar29,0x55);
      local_1278._16_16_ = auVar40;
      local_1278._0_16_ = auVar40;
      auVar49 = ZEXT3264(local_1278);
      auVar40 = vshufpd_avx(auVar29,auVar29,1);
      auVar43 = ZEXT1664(auVar40);
      auVar28 = vshufps_avx(auVar29,auVar29,0xaa);
      auVar32 = ZEXT1664(auVar28);
      local_1298._16_16_ = auVar28;
      local_1298._0_16_ = auVar28;
      auVar50 = ZEXT3264(local_1298);
      uVar20 = (ulong)(auVar29._0_4_ < 0.0) << 5;
      uVar23 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      uVar19 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
      uVar22 = uVar20 ^ 0x20;
      auVar24 = vshufps_avx(auVar7,auVar7,0);
      auVar27 = ZEXT1664(auVar24);
      local_12b8._16_16_ = auVar24;
      local_12b8._0_16_ = auVar24;
      auVar44 = ZEXT3264(local_12b8);
      auVar24 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_12d8._16_16_ = auVar24;
      local_12d8._0_16_ = auVar24;
      auVar51 = ZEXT3264(local_12d8);
      local_1350 = context;
      local_1348 = uVar20;
      local_1340 = ray;
      do {
        uVar21 = local_1360[-1];
        local_1360 = local_1360 + -1;
        while ((uVar21 & 8) == 0) {
          uVar15 = uVar21 & 0xfffffffffffffff0;
          fVar3 = (ray->dir).field_0.m128[3];
          auVar25._4_4_ = fVar3;
          auVar25._0_4_ = fVar3;
          auVar25._8_4_ = fVar3;
          auVar25._12_4_ = fVar3;
          auVar25._16_4_ = fVar3;
          auVar25._20_4_ = fVar3;
          auVar25._24_4_ = fVar3;
          auVar25._28_4_ = fVar3;
          pfVar2 = (float *)(uVar15 + 0x100 + uVar20);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar20);
          auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar26._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar26._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar26._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar26._28_4_ = auVar27._28_4_ + pfVar1[7];
          auVar26 = vsubps_avx(auVar26,auVar45._0_32_);
          auVar8._4_4_ = auVar48._4_4_ * auVar26._4_4_;
          auVar8._0_4_ = auVar48._0_4_ * auVar26._0_4_;
          auVar8._8_4_ = auVar48._8_4_ * auVar26._8_4_;
          auVar8._12_4_ = auVar48._12_4_ * auVar26._12_4_;
          auVar8._16_4_ = auVar48._16_4_ * auVar26._16_4_;
          auVar8._20_4_ = auVar48._20_4_ * auVar26._20_4_;
          auVar8._24_4_ = auVar48._24_4_ * auVar26._24_4_;
          auVar8._28_4_ = auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar44._0_32_,auVar8);
          pfVar2 = (float *)(uVar15 + 0x100 + uVar23);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar23);
          auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar30._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar30._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar30._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar30._28_4_ = auVar32._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar30,auVar46._0_32_);
          auVar10._4_4_ = auVar49._4_4_ * auVar8._4_4_;
          auVar10._0_4_ = auVar49._0_4_ * auVar8._0_4_;
          auVar10._8_4_ = auVar49._8_4_ * auVar8._8_4_;
          auVar10._12_4_ = auVar49._12_4_ * auVar8._12_4_;
          auVar10._16_4_ = auVar49._16_4_ * auVar8._16_4_;
          auVar10._20_4_ = auVar49._20_4_ * auVar8._20_4_;
          auVar10._24_4_ = auVar49._24_4_ * auVar8._24_4_;
          auVar10._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar15 + 0x100 + uVar19);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar19);
          auVar34._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar34._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar34._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar34._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar34._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar34._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar34._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar34._28_4_ = auVar36._28_4_ + pfVar1[7];
          auVar30 = vsubps_avx(auVar34,auVar47._0_32_);
          auVar11._4_4_ = auVar50._4_4_ * auVar30._4_4_;
          auVar11._0_4_ = auVar50._0_4_ * auVar30._0_4_;
          auVar11._8_4_ = auVar50._8_4_ * auVar30._8_4_;
          auVar11._12_4_ = auVar50._12_4_ * auVar30._12_4_;
          auVar11._16_4_ = auVar50._16_4_ * auVar30._16_4_;
          auVar11._20_4_ = auVar50._20_4_ * auVar30._20_4_;
          auVar11._24_4_ = auVar50._24_4_ * auVar30._24_4_;
          auVar11._28_4_ = auVar30._28_4_;
          auVar8 = vmaxps_avx(auVar10,auVar11);
          auVar26 = vmaxps_avx(auVar26,auVar8);
          pfVar2 = (float *)(uVar15 + 0x100 + uVar22);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar22);
          auVar31._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar31._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar31._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar31._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar31._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar31._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar31._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar31._28_4_ = auVar8._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar31,auVar45._0_32_);
          auVar12._4_4_ = auVar48._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar48._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar48._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar48._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar48._16_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar48._20_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar48._24_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar15 + 0x100 + (uVar23 ^ 0x20));
          auVar8 = vminps_avx(auVar51._0_32_,auVar12);
          pfVar1 = (float *)(uVar15 + 0x40 + (uVar23 ^ 0x20));
          auVar35._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar35._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar35._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar35._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar35._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar35._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar35._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar35._28_4_ = auVar30._28_4_ + pfVar1[7];
          auVar30 = vsubps_avx(auVar35,auVar46._0_32_);
          pfVar2 = (float *)(uVar15 + 0x100 + (uVar19 ^ 0x20));
          pfVar1 = (float *)(uVar15 + 0x40 + (uVar19 ^ 0x20));
          auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar42._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar42._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar42._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar42._28_4_ = auVar43._28_4_ + pfVar1[7];
          auVar13._4_4_ = auVar49._4_4_ * auVar30._4_4_;
          auVar13._0_4_ = auVar49._0_4_ * auVar30._0_4_;
          auVar13._8_4_ = auVar49._8_4_ * auVar30._8_4_;
          auVar13._12_4_ = auVar49._12_4_ * auVar30._12_4_;
          auVar13._16_4_ = auVar49._16_4_ * auVar30._16_4_;
          auVar13._20_4_ = auVar49._20_4_ * auVar30._20_4_;
          auVar13._24_4_ = auVar49._24_4_ * auVar30._24_4_;
          auVar13._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar42,auVar47._0_32_);
          auVar14._4_4_ = auVar50._4_4_ * auVar30._4_4_;
          auVar14._0_4_ = auVar50._0_4_ * auVar30._0_4_;
          auVar14._8_4_ = auVar50._8_4_ * auVar30._8_4_;
          auVar14._12_4_ = auVar50._12_4_ * auVar30._12_4_;
          auVar14._16_4_ = auVar50._16_4_ * auVar30._16_4_;
          auVar14._20_4_ = auVar50._20_4_ * auVar30._20_4_;
          auVar14._24_4_ = auVar50._24_4_ * auVar30._24_4_;
          auVar14._28_4_ = auVar30._28_4_;
          auVar43 = ZEXT3264(auVar14);
          auVar30 = vminps_avx(auVar13,auVar14);
          auVar36 = ZEXT3264(auVar30);
          auVar8 = vminps_avx(auVar8,auVar30);
          auVar26 = vcmpps_avx(auVar26,auVar8,2);
          auVar27 = ZEXT3264(auVar26);
          if (((uint)uVar21 & 7) == 6) {
            auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar25,2);
            auVar30 = vcmpps_avx(auVar25,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
            auVar30 = vandps_avx(auVar8,auVar30);
            auVar26 = vandps_avx(auVar30,auVar26);
            auVar27 = ZEXT1664(auVar26._16_16_);
            auVar24 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          }
          else {
            auVar24 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          }
          auVar32 = ZEXT3264(auVar8);
          auVar24 = vpsllw_avx(auVar24,0xf);
          if ((((((((auVar24 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar24 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar24[0xf]) goto LAB_002f1037;
          auVar24 = vpacksswb_avx(auVar24,auVar24);
          bVar9 = SUB161(auVar24 >> 7,0) & 1 | (SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar24 >> 0x17,0) & 1) << 2 | (SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar24 >> 0x27,0) & 1) << 4 | (SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar24 >> 0x37,0) & 1) << 6 | SUB161(auVar24 >> 0x3f,0) << 7;
          lVar6 = 0;
          if (bVar9 != 0) {
            for (; (bVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar21 = *(ulong *)(uVar15 + lVar6 * 8);
          uVar18 = bVar9 - 1 & (uint)bVar9;
          if (uVar18 != 0) {
            *local_1360 = uVar21;
            local_1360 = local_1360 + 1;
            lVar6 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar21 = *(ulong *)(uVar15 + lVar6 * 8);
            uVar18 = uVar18 - 1 & uVar18;
            uVar16 = (ulong)uVar18;
            if (uVar18 != 0) {
              do {
                *local_1360 = uVar21;
                local_1360 = local_1360 + 1;
                lVar6 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar21 = *(ulong *)(uVar15 + lVar6 * 8);
                uVar16 = uVar16 & uVar16 - 1;
              } while (uVar16 != 0);
            }
          }
        }
        local_1330 = (ulong)((uint)uVar21 & 0xf) - 8;
        if (local_1330 != 0) {
          local_1338 = local_1350->scene;
          local_1328 = 0;
          do {
            local_1320.geomID = *(uint *)((uVar21 & 0xfffffffffffffff0) + local_1328 * 8);
            local_12f0 = (local_1338->geometries).items[local_1320.geomID].ptr;
            if ((ray->mask & local_12f0->mask) != 0) {
              local_1320.primID = *(uint *)((uVar21 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
              local_1354 = -1;
              local_1320.valid = &local_1354;
              local_1320.geometryUserPtr = local_12f0->userPtr;
              local_1320.context = local_1350->user;
              local_1320.N = 1;
              local_12e8 = 0;
              local_12e0 = local_1350->args;
              p_Var17 = local_12e0->intersect;
              if (p_Var17 == (RTCIntersectFunctionN)0x0) {
                p_Var17 = (RTCIntersectFunctionN)
                          local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                          ._M_i;
              }
              auVar32 = ZEXT1664(auVar32._0_16_);
              auVar36 = ZEXT1664(auVar36._0_16_);
              auVar43 = ZEXT1664(auVar43._0_16_);
              local_1320.rayhit = (RTCRayHitN *)ray;
              (*p_Var17)(&local_1320);
              auVar27._8_56_ = extraout_var;
              auVar27._0_8_ = extraout_XMM1_Qa;
              auVar45 = ZEXT3264(local_11f8);
              auVar46 = ZEXT3264(local_1218);
              auVar47 = ZEXT3264(local_1238);
              auVar48 = ZEXT3264(local_1258);
              auVar49 = ZEXT3264(local_1278);
              auVar50 = ZEXT3264(local_1298);
              auVar44 = ZEXT3264(local_12b8);
              auVar51 = ZEXT3264(local_12d8);
              ray = local_1340;
              uVar20 = local_1348;
              if (local_1340->tfar < 0.0) {
                local_1340->tfar = -INFINITY;
                return;
              }
            }
            local_1328 = local_1328 + 1;
          } while (local_1330 != local_1328);
        }
LAB_002f1037:
      } while (local_1360 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }